

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O0

void Float32_To_Int8_DitherClip
               (void *destinationBuffer,int destinationStride,void *sourceBuffer,int sourceStride,
               uint count,PaUtilTriangularDitherGenerator *ditherGenerator)

{
  int in_ECX;
  float *in_RDX;
  int in_ESI;
  undefined1 *in_RDI;
  int in_R8D;
  PaUtilTriangularDitherGenerator *in_R9;
  float fVar1;
  PaInt32 samp;
  float dithered;
  float dither;
  char *dest;
  float *src;
  int local_4c;
  undefined1 local_48;
  undefined1 *local_38;
  float *local_30;
  int local_20;
  
  local_38 = in_RDI;
  local_30 = in_RDX;
  local_20 = in_R8D;
  while (local_20 != 0) {
    fVar1 = PaUtil_GenerateFloatTriangularDither(in_R9);
    local_4c = (int)(*local_30 * 126.0 + fVar1);
    if (local_4c < -0x80) {
      local_48 = 0x80;
    }
    else {
      if (0x7f < local_4c) {
        local_4c = 0x7f;
      }
      local_48 = (undefined1)local_4c;
    }
    *local_38 = local_48;
    local_30 = local_30 + in_ECX;
    local_38 = local_38 + in_ESI;
    local_20 = local_20 + -1;
  }
  return;
}

Assistant:

static void Float32_To_Int8_DitherClip(
    void *destinationBuffer, signed int destinationStride,
    void *sourceBuffer, signed int sourceStride,
    unsigned int count, struct PaUtilTriangularDitherGenerator *ditherGenerator )
{
    float *src = (float*)sourceBuffer;
    signed char *dest =  (signed char*)destinationBuffer;
    (void)ditherGenerator; /* unused parameter */

    while( count-- )
    {
        float dither  = PaUtil_GenerateFloatTriangularDither( ditherGenerator );
        /* use smaller scaler to prevent overflow when we add the dither */
        float dithered = (*src * (126.0f)) + dither;
        PaInt32 samp = (PaInt32) dithered;
        PA_CLIP_( samp, -0x80, 0x7F );
        *dest = (signed char) samp;

        src += sourceStride;
        dest += destinationStride;
    }
}